

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O3

QRect __thiscall QVariant::toRect(QVariant *this)

{
  PrivateShared *pPVar1;
  QRect QVar2;
  bool bVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  QMetaType local_30;
  QMetaType local_28;
  undefined4 uStack_20;
  Representation RStack_1c;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QRect>::metaType;
  uVar4 = *(ulong *)&(this->d).field_0x18 & 0xfffffffffffffffc;
  local_28.d_ptr._0_4_ = (undefined4)uVar4;
  local_28.d_ptr._4_4_ = (undefined4)(uVar4 >> 0x20);
  bVar3 = ::comparesEqual(&local_28,&local_30);
  if (bVar3) {
    if (((this->d).field_0x18 & 1) != 0) {
      pPVar1 = (this->d).data.shared;
      this = (QVariant *)
             ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                     .super___atomic_base<int> + (long)pPVar1->offset);
    }
    local_28.d_ptr._0_4_ = *(undefined4 *)&(this->d).data;
    local_28.d_ptr._4_4_ = *(undefined4 *)((long)&(this->d).data + 4);
    uStack_20 = *(undefined4 *)((long)&(this->d).data + 8);
    RStack_1c.m_i = *(int *)((long)&(this->d).data + 0xc);
  }
  else {
    local_28.d_ptr._0_4_ = 0;
    local_28.d_ptr._4_4_ = 0;
    uStack_20 = 0xffffffff;
    RStack_1c.m_i = -1;
    uVar4 = *(ulong *)&(this->d).field_0x18;
    if ((uVar4 & 1) != 0) {
      pPVar1 = (this->d).data.shared;
      this = (QVariant *)
             ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                     .super___atomic_base<int> + (long)pPVar1->offset);
    }
    QMetaType::convert((QMetaTypeInterface *)(uVar4 & 0xfffffffffffffffc),this,local_30,&local_28);
  }
  QVar2.y1.m_i = local_28.d_ptr._4_4_;
  QVar2.x1.m_i = local_28.d_ptr._0_4_;
  QVar2.x2.m_i = uStack_20;
  QVar2.y2.m_i = RStack_1c.m_i;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QRect QVariant::toRect() const
{
    return qvariant_cast<QRect>(*this);
}